

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_counter.cc
# Opt level: O0

void __thiscall absl::lts_20240722::BlockingCounter::Wait(BlockingCounter *this)

{
  Condition local_50;
  char *local_20;
  char *absl_raw_log_internal_basename;
  MutexLock l;
  BlockingCounter *this_local;
  
  l.mu_ = &this->lock_;
  MutexLock::MutexLock((MutexLock *)&absl_raw_log_internal_basename,&this->lock_);
  if (this->num_waiting_ == 0) {
    this->num_waiting_ = this->num_waiting_ + 1;
    Condition::Condition(&local_50,anon_unknown_15::IsDone,&this->done_);
    Mutex::Await(&this->lock_,&local_50);
    MutexLock::~MutexLock((MutexLock *)&absl_raw_log_internal_basename);
    return;
  }
  local_20 = "blocking_counter.cc";
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"blocking_counter.cc",0x37,"Check %s failed: %s","num_waiting_ == 0",
             "multiple threads called Wait()");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/blocking_counter.cc"
                ,0x37,"void absl::BlockingCounter::Wait()");
}

Assistant:

void BlockingCounter::Wait() {
  MutexLock l(&this->lock_);

  // only one thread may call Wait(). To support more than one thread,
  // implement a counter num_to_exit, like in the Barrier class.
  ABSL_RAW_CHECK(num_waiting_ == 0, "multiple threads called Wait()");
  num_waiting_++;

  this->lock_.Await(Condition(IsDone, &this->done_));

  // At this point, we know that all threads executing DecrementCount
  // will not touch this object again.
  // Therefore, the thread calling this method is free to delete the object
  // after we return from this method.
}